

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

LY_ERR ly_ctx_set_searchdir(ly_ctx *ctx,char *search_dir)

{
  byte *pbVar1;
  lyd_node **pplVar2;
  lyd_node *plVar3;
  int iVar4;
  LY_ERR LVar5;
  char *__s2;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  char *format;
  uint uVar9;
  long lVar10;
  LY_ERR LVar11;
  lyd_node *plVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  stat st;
  stat local_c0;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_set_searchdir");
    return LY_EINVAL;
  }
  if (search_dir == (char *)0x0) {
    return LY_SUCCESS;
  }
  __s2 = realpath(search_dir,(char *)0x0);
  if (__s2 == (char *)0x0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    format = "Unable to use search directory \"%s\" (%s).";
LAB_0011b04c:
    ly_log(ctx,LY_LLERR,LY_ESYS,format,search_dir,pcVar7);
  }
  else {
    iVar4 = strcmp(search_dir,__s2);
    if (iVar4 != 0) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Search directory string \"%s\" canonized to \"%s\"."
             ,search_dir,__s2);
    }
    iVar4 = access(__s2,5);
    if (iVar4 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      format = "Unable to fully access search directory \"%s\" (%s).";
      search_dir = __s2;
      goto LAB_0011b04c;
    }
    iVar4 = stat(__s2,&local_c0);
    if (iVar4 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      LVar11 = LY_ESYS;
      ly_log(ctx,LY_LLERR,LY_ESYS,"stat() failed for \"%s\" (%s).",__s2,pcVar7);
      goto LAB_0011b05b;
    }
    if ((local_c0.st_mode & 0xf000) == 0x4000) {
      uVar8 = (ulong)(ctx->search_paths).count;
      if (uVar8 != 0) {
        pplVar2 = (ctx->search_paths).field_2.dnodes;
        uVar15 = 0;
        do {
          iVar4 = strcmp(__s2,(char *)pplVar2[uVar15]);
          if (iVar4 == 0) {
            LVar11 = LY_EEXIST;
            goto LAB_0011b05b;
          }
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
      }
      LVar11 = LY_EMEM;
      LVar5 = ly_set_add(&ctx->search_paths,__s2,'\x01',(uint32_t *)0x0);
      if (LVar5 == LY_SUCCESS) {
        uVar9 = (ctx->list).count;
        if (uVar9 == 0) {
          return LY_SUCCESS;
        }
        uVar8 = 0;
        do {
          plVar3 = (ctx->list).field_2.dnodes[uVar8];
          pbVar1 = (byte *)((long)&plVar3[2].schema + 2);
          *pbVar1 = *pbVar1 & 0xfd;
          if ((plVar3[1].next != (lyd_node *)0x0) &&
             (plVar12 = (plVar3[1].next)->next, plVar12 != (lyd_node *)0x0)) {
            lVar10 = 0;
            pvVar13 = (void *)0x0;
            while( true ) {
              if (plVar12 == (lyd_node *)0x0) {
                pvVar14 = (void *)0x0;
              }
              else {
                pvVar14 = plVar12[-1].priv;
              }
              if (pvVar14 <= pvVar13) break;
              pbVar1 = (byte *)(*(long *)((long)&plVar12->hash + lVar10) + 0x79);
              *pbVar1 = *pbVar1 & 0xf7;
              pvVar13 = (void *)((long)pvVar13 + 1);
              plVar12 = (plVar3[1].next)->next;
              lVar10 = lVar10 + 0x38;
            }
            uVar9 = (ctx->list).count;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar9);
        return LY_SUCCESS;
      }
      goto LAB_0011b05b;
    }
    ly_log(ctx,LY_LLERR,LY_ESYS,"Given search directory \"%s\" is not a directory.",__s2);
  }
  LVar11 = LY_EINVAL;
LAB_0011b05b:
  free(__s2);
  return LVar11;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_set_searchdir(struct ly_ctx *ctx, const char *search_dir)
{
    int rc = LY_SUCCESS;
    struct stat st;
    char *new_dir = NULL;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module *mod;

    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    if (!search_dir) {
        /* fine, ignore */
        goto cleanup;
    }

    new_dir = realpath(search_dir, NULL);
    if (!new_dir) {
        LOGERR(ctx, LY_ESYS, "Unable to use search directory \"%s\" (%s).", search_dir, strerror(errno)),
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (strcmp(search_dir, new_dir)) {
        LOGVRB("Search directory string \"%s\" canonized to \"%s\".", search_dir, new_dir);
    }

    if (access(new_dir, R_OK | X_OK)) {
        LOGERR(ctx, LY_ESYS, "Unable to fully access search directory \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (stat(new_dir, &st)) {
        LOGERR(ctx, LY_ESYS, "stat() failed for \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_ESYS;
        goto cleanup;
    }
    if (!S_ISDIR(st.st_mode)) {
        LOGERR(ctx, LY_ESYS, "Given search directory \"%s\" is not a directory.", new_dir);
        rc = LY_EINVAL;
        goto cleanup;
    }

    /* avoid path duplication */
    for (i = 0; i < ctx->search_paths.count; ++i) {
        if (!strcmp(new_dir, ctx->search_paths.objs[i])) {
            rc = LY_EEXIST;
            goto cleanup;
        }
    }
    if (ly_set_add(&ctx->search_paths, new_dir, 1, NULL)) {
        rc = LY_EMEM;
        goto cleanup;
    }

    /* new searchdir - reset latests flags (possibly new revisions available) */
    for (i = 0; i < ctx->list.count; ++i) {
        mod = ctx->list.objs[i];

        mod->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
        if (mod->parsed && mod->parsed->includes) {
            for (u = 0; u < LY_ARRAY_COUNT(mod->parsed->includes); ++u) {
                mod->parsed->includes[u].submodule->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
            }
        }
    }

cleanup:
    if (rc) {
        free(new_dir);
    }
    return rc;
}